

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-mon.c
# Opt level: O0

void project_monster_teleport_away(project_monster_handler_context_t *context,wchar_t flag)

{
  _Bool _Var1;
  wchar_t flag_local;
  project_monster_handler_context_t *context_local;
  
  if ((context->seen & 1U) != 0) {
    flag_on_dbg(context->lore->flags,0xb,flag,"context->lore->flags","flag");
  }
  _Var1 = flag_has_dbg(context->mon->race->flags,0xb,flag,"context->mon->race->flags","flag");
  if (_Var1) {
    context->teleport_distance = context->dam;
    context->hurt_msg = MON_MSG_DISAPPEAR;
    monster_wake(context->mon,false,L'd');
    if ((context->seen & 1U) != 0) {
      context->obvious = true;
    }
  }
  else {
    context->skipped = true;
  }
  context->dam = L'\0';
  return;
}

Assistant:

static void project_monster_teleport_away(project_monster_handler_context_t *context, int flag)
{
	if (context->seen) rf_on(context->lore->flags, flag);

	if (rf_has(context->mon->race->flags, flag)) {
		context->teleport_distance = context->dam;
		context->hurt_msg = MON_MSG_DISAPPEAR;
		monster_wake(context->mon, false, 100);
		if (context->seen) context->obvious = true;
	} else {
		context->skipped = true;
	}

	context->dam = 0;
}